

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::PrintShortRepeatedField
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,
          BaseTextGenerator *generator)

{
  BaseTextGenerator *pBVar1;
  int local_5c;
  undefined1 auStack_58 [4];
  int i;
  char *local_50;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  int local_34;
  BaseTextGenerator *pBStack_30;
  int size;
  BaseTextGenerator *generator_local;
  FieldDescriptor *field_local;
  Reflection *reflection_local;
  Message *message_local;
  Printer *this_local;
  
  pBStack_30 = generator;
  generator_local = (BaseTextGenerator *)field;
  field_local = (FieldDescriptor *)reflection;
  reflection_local = (Reflection *)message;
  message_local = (Message *)this;
  local_34 = Reflection::FieldSize(reflection,message,field);
  PrintFieldName(this,(Message *)reflection_local,-1,local_34,(Reflection *)field_local,
                 (FieldDescriptor *)generator_local,pBStack_30);
  pBVar1 = pBStack_30;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,": ");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_58,"[");
  (*pBVar1->_vptr_BaseTextGenerator[7])(pBVar1,local_48._M_len,local_48._M_str,_auStack_58,local_50)
  ;
  for (local_5c = 0; local_5c < local_34; local_5c = local_5c + 1) {
    if (0 < local_5c) {
      BaseTextGenerator::PrintLiteral<3ul>(pBStack_30,(char (*) [3])0x603bb2);
    }
    PrintFieldValue(this,(Message *)reflection_local,(Reflection *)field_local,
                    (FieldDescriptor *)generator_local,local_5c,pBStack_30);
  }
  if ((this->single_line_mode_ & 1U) == 0) {
    BaseTextGenerator::PrintLiteral<3ul>(pBStack_30,(char (*) [3])"]\n");
  }
  else {
    BaseTextGenerator::PrintLiteral<3ul>(pBStack_30,(char (*) [3])"] ");
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintShortRepeatedField(
    const Message& message, const Reflection* reflection,
    const FieldDescriptor* field, BaseTextGenerator* generator) const {
  // Print primitive repeated field in short form.
  int size = reflection->FieldSize(message, field);
  PrintFieldName(message, /*field_index=*/-1, /*field_count=*/size, reflection,
                 field, generator);
  generator->PrintMaybeWithMarker(MarkerToken(), ": ", "[");
  for (int i = 0; i < size; i++) {
    if (i > 0) generator->PrintLiteral(", ");
    PrintFieldValue(message, reflection, field, i, generator);
  }
  if (single_line_mode_) {
    generator->PrintLiteral("] ");
  } else {
    generator->PrintLiteral("]\n");
  }
}